

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ObjIsMuxType(Gia_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool local_55;
  bool local_31;
  Gia_Obj_t *pNode1;
  Gia_Obj_t *pNode0;
  Gia_Obj_t *pNode_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x38a,"int Gia_ObjIsMuxType(Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsAnd(pNode);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsBuf(pNode), iVar1 != 0)) {
    return 0;
  }
  iVar1 = Gia_ObjFaninC0(pNode);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(pNode), iVar1 == 0)) {
    return 0;
  }
  pObj = Gia_ObjFanin0(pNode);
  pObj_00 = Gia_ObjFanin1(pNode);
  iVar1 = Gia_ObjIsAnd(pObj);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsAnd(pObj_00), iVar1 == 0)) {
    return 0;
  }
  pGVar3 = Gia_ObjFanin0(pObj);
  pGVar4 = Gia_ObjFanin0(pObj_00);
  if (pGVar3 == pGVar4) {
    iVar1 = Gia_ObjFaninC0(pObj);
    iVar2 = Gia_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_002547c9;
  }
  pGVar3 = Gia_ObjFanin0(pObj);
  pGVar4 = Gia_ObjFanin1(pObj_00);
  if (pGVar3 == pGVar4) {
    iVar1 = Gia_ObjFaninC0(pObj);
    iVar2 = Gia_ObjFaninC1(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_002547c9;
  }
  pGVar3 = Gia_ObjFanin1(pObj);
  pGVar4 = Gia_ObjFanin0(pObj_00);
  if (pGVar3 == pGVar4) {
    iVar1 = Gia_ObjFaninC1(pObj);
    iVar2 = Gia_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_002547c9;
  }
  pGVar3 = Gia_ObjFanin1(pObj);
  pGVar4 = Gia_ObjFanin1(pObj_00);
  local_55 = false;
  if (pGVar3 == pGVar4) {
    iVar1 = Gia_ObjFaninC1(pObj);
    iVar2 = Gia_ObjFaninC1(pObj_00);
    local_55 = iVar1 != iVar2;
  }
  local_31 = local_55;
LAB_002547c9:
  return (uint)local_31;
}

Assistant:

int Gia_ObjIsMuxType( Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Gia_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Gia_ObjIsAnd(pNode) || Gia_ObjIsBuf(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Gia_ObjFaninC0(pNode) || !Gia_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Gia_ObjIsAnd(pNode0) || !Gia_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1))) || 
           (Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)));
}